

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

int trupdate(custom_function *funcpt,double *xi,double *jac,double *step,int N,double *dx,
            double maxstep,int retcode,double *L,double *hess,double stol,int method,double *ioval,
            double *xprev,double *funcprev,double *x)

{
  double dVar1;
  int iVar2;
  double *C;
  double *array;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  char *__format;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = *ioval;
  C = (double *)malloc(8);
  lVar9 = (long)N;
  array = (double *)malloc(lVar9 * 8);
  uVar3 = 0;
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  dVar10 = 0.0;
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    dVar10 = dVar10 + dx[uVar3] * step[uVar3] * dx[uVar3] * step[uVar3];
  }
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dVar11 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if (1.79769313486232e+308 <= ABS(dVar11)) {
LAB_00124adc:
    __format = "Program Exiting as the function value exceeds the maximum double value";
  }
  else {
    if (!NAN(dVar11)) {
      madd(xi,step,x,1,N);
      dVar12 = (*funcpt->funcpt)(x,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar12)) goto LAB_00124adc;
      if (NAN(dVar12)) goto LAB_00124e3e;
      dVar11 = dVar12 - dVar11;
      mmult(jac,step,C,1,N,1);
      if (retcode == 3) {
        dVar13 = *C;
        dVar14 = dVar13 * 0.0001;
        if ((dVar11 <= dVar14) && (dVar12 < *funcprev)) goto LAB_00124b1c;
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          x[uVar3] = xprev[uVar3];
        }
LAB_00124d77:
        iVar2 = 0;
        dVar15 = dVar1 * 0.5;
      }
      else {
        *funcprev = 0.0;
        dVar13 = *C;
        dVar14 = dVar13 * 0.0001;
LAB_00124b1c:
        dVar15 = dVar1;
        if (dVar14 <= dVar11) {
          for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
            dVar12 = ABS(xi[uVar3]);
            if (ABS(xi[uVar3]) <= 1.0 / ABS(dx[uVar3])) {
              dVar12 = 1.0 / ABS(dx[uVar3]);
            }
            array[uVar3] = step[uVar3] / dVar12;
          }
          dVar12 = array_max_abs(array,N);
          if (dVar12 < stol) {
            iVar2 = 1;
            for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
              x[uVar3] = xi[uVar3];
            }
          }
          else {
            dVar10 = (-*C * dVar10) / ((dVar11 - dVar10) + (dVar11 - dVar10));
            iVar2 = 2;
            dVar15 = dVar1 * 0.1;
            if ((dVar1 * 0.1 <= dVar10) && (dVar15 = dVar1 * 0.5, dVar10 <= dVar1 * 0.5)) {
              dVar15 = dVar10;
            }
          }
        }
        else {
          dVar10 = dVar13;
          if (method == 1) {
            uVar3 = (ulong)(uint)N;
            for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
              dVar14 = 0.0;
              pdVar4 = L;
              for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
                dVar14 = dVar14 + *pdVar4 * step[uVar8];
                pdVar4 = pdVar4 + lVar9;
              }
              dVar10 = dVar10 + dVar14 * dVar14 * 0.5;
              uVar3 = uVar3 - 1;
              step = step + 1;
              L = L + lVar9 + 1;
            }
          }
          else if (method == 0) {
            iVar2 = 1;
            pdVar4 = hess;
            for (uVar3 = 0; uVar3 != uVar6; uVar3 = uVar3 + 1) {
              dVar14 = step[uVar3];
              dVar16 = hess[uVar3 * lVar9 + uVar3] * 0.5 * dVar14 * dVar14;
              for (lVar7 = (long)iVar2; lVar7 < lVar9; lVar7 = lVar7 + 1) {
                dVar16 = dVar16 + pdVar4[lVar7] * dVar14 * step[lVar7];
              }
              dVar10 = dVar10 + dVar16;
              iVar2 = iVar2 + 1;
              pdVar4 = pdVar4 + lVar9;
            }
          }
          if ((retcode == 2) ||
             ((((ABS(dVar11) < ABS(dVar10 - dVar11) && (dVar13 < dVar11)) || (ioval[6] != 0.0)) ||
              ((NAN(ioval[6]) || (maxstep * 0.99 < dVar1)))))) {
            if (dVar10 * 0.1 <= dVar11) goto LAB_00124d77;
            iVar2 = 0;
            if ((dVar11 <= dVar10 * 0.75) && (dVar15 = dVar1 + dVar1, maxstep <= dVar1 + dVar1)) {
              dVar15 = maxstep;
            }
          }
          else {
            *funcprev = dVar12;
            for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
              xprev[uVar3] = x[uVar3];
            }
            dVar15 = dVar1 + dVar1;
            if (maxstep <= dVar1 + dVar1) {
              dVar15 = maxstep;
            }
            iVar2 = 3;
          }
        }
      }
      *ioval = dVar15;
      goto LAB_00124d8b;
    }
LAB_00124e3e:
    __format = "Program Exiting as the function returns NaN";
  }
  printf(__format);
  iVar2 = 0xf;
LAB_00124d8b:
  free(array);
  free(C);
  return iVar2;
}

Assistant:

int trupdate(custom_function *funcpt,double *xi,double *jac,double *step,int N,double * dx,double maxstep,
		int retcode,double *L,double *hess,double stol,int method,double *ioval,double *xprev,double *funcprev,double *x) {
			
	int retval;	
	int i,j,c1;
	double delta,alpha,nlen,rell,den,deltatemp;
	double funci,funcf,df,dfp,temp;
	double *slopei,*rcheck;
	/*Return Codes
	 * 
	 * 0 - x Accepted.
	 * 1 - x unsatisfactory but (x-xi) is smaller than stopping criteria stol
	 * 2 - f(x) large. Reduce delta
	 * 3 - f(x) sufficiently small. Double delta
	 * 
	 */ 
	 
	alpha = 1.0e-04;
	delta = ioval[0];
	nlen = 0.0;
	 
	slopei = (double*) malloc(sizeof(double) *1);
	rcheck = (double*) malloc(sizeof(double) *N);
 
	for(i = 0; i < N;++i) {
		nlen += dx[i] * step[i] * dx[i] * step[i];
	}
	nlen = sqrt(nlen);
	
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(rcheck);
		free(slopei);
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		free(rcheck);
		free(slopei);
		return 15;
	}
	
	madd(xi,step,x,1,N);
	
	funcf = FUNCPT_EVAL(funcpt, x, N);
	if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(rcheck);
		free(slopei);
		return 15;
	}
	if (funcf != funcf) {
		printf("Program Exiting as the function returns NaN");
		free(rcheck);
		free(slopei);
		return 15;
	}
	
	df = funcf - funci;
	mmult(jac,step,slopei,1,N,1);
	 
	if (retcode != 3) {
		*funcprev = 0.;
	} 
	
	if ((df > alpha *slopei[0] || funcf >= *funcprev) && retcode == 3) {
		for(i = 0;i < N;++i) {
			x[i] = xprev[i];
		}
		retval = 0;
		funcf = *funcprev;
		delta /= 2.0;
	} else if (df >= alpha *slopei[0]) {
		for(i = 0; i < N;++i) {
			if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
				den = fabs(xi[i]);
			} else {
				den = 1.0 /fabs(dx[i]);
			}
			rcheck[i] = step[i]/den;
		}
	
		rell = array_max_abs(rcheck,N);
		
		if (rell < stol) {
			retval = 1;
			for(i = 0; i < N;++i) {
				x[i] = xi[i];
			}
		} else {
			retval = 2;
			deltatemp = - slopei[0] * nlen /(2*(df - nlen));
			if (deltatemp < 0.1 * delta) {
				delta *= 0.1;
			} else if (deltatemp > 0.5 * delta) {
				delta *= 0.5;
			} else {
				delta = deltatemp;
			}
		}
		
	} else {
		dfp = slopei[0];
		if (method == 0) {
			for (i = 0;i < N;++i) {
				//Hook
				c1 = i * N;
				temp = 0.5 * hess[c1+i] * step[i] * step[i];
				for (j = i+1; j < N;++j) {
					temp += hess[c1+j] * step[i] * step[j];
				}
				dfp += temp;
			}
		} else if (method == 1) {
			//Double Dogleg
			for (i = 0; i < N;++i) {
				temp = 0.0;
				for(j = i; j < N;++j) {
					temp += L[j*N+i] * step[j];
				}
				dfp += temp*temp/2.0;
			}
		}
		
		if ((retcode != 2) && (fabs(dfp - df) <= fabs(df) || df <= slopei[0]) && (ioval[6] == 0.0) && (delta <= 0.99*maxstep)) {
			retval = 3;
			*funcprev = funcf;
			for(i = 0; i < N;++i) {
				xprev[i] = x[i];
			}
			if (maxstep > 2*delta) {
				delta = 2 * delta;
			} else {
				delta = maxstep;
			}
			
		} else {
			retval = 0;
			if (df >= 0.1 * dfp) {
				delta = delta/2;
			} else if (df <= 0.75 *dfp) {
				if (maxstep > 2*delta) {
				delta = 2 * delta;
				} else {
					delta = maxstep;
				}
				
			}
		}
	}
	
	
	ioval[0] = delta;
	free(rcheck);
	free(slopei); 
	return retval;
		
}